

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O2

void __thiscall
QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(CurrencyToStringArgument *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->symbol).d);
  ::QVariant::~QVariant(&this->value);
  return;
}

Assistant:

CurrencyToStringArgument(const QVariant &v, const QString &s)
            : value(v), symbol(s) { }